

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

void oss_gets_backsp(osgen_txtwin_t *win,char *buf,char **p,char **eol,int *x,int *y)

{
  char *__dest;
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar1 = ossgetcolor((int)(win->base).txtfg,(int)(win->base).txtbg,(win->base).txtattr,
                      (int)(win->base).fillcolor);
  if (S_gets_internal_buf < *(char **)buf) {
    *(char **)buf = *(char **)buf + -1;
    pcVar4 = *p + -1;
    *p = pcVar4;
    __dest = *(char **)buf;
    if (__dest != pcVar4) {
      memmove(__dest,__dest + 1,(long)pcVar4 - (long)__dest);
    }
    iVar7 = *(int *)eol;
    *(int *)eol = iVar7 + -1;
    iVar6 = (win->base).winx;
    if (iVar7 <= iVar6) {
      *(int *)eol = (int)(win->base).wid + iVar6 + -1;
      *x = *x + -1;
    }
    **p = '\0';
    iVar7 = *x;
    iVar6 = *(int *)eol;
    ossdsp_str(&win->base,iVar7,iVar6,iVar1,*(char **)buf,(long)*p - (long)*(char **)buf,(int *)0x0)
    ;
    if (*p != *(char **)buf) {
      iVar1 = (win->base).winx;
      iVar3 = (int)(win->base).wid + iVar1;
      lVar2 = (long)*(char **)buf - (long)*p;
      do {
        iVar5 = iVar6 + 1;
        iVar6 = iVar5;
        if (iVar3 <= iVar5) {
          iVar6 = iVar1;
        }
        iVar7 = iVar7 + (uint)(iVar3 <= iVar5);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
    ossclr(iVar7,iVar6,iVar7,iVar6,(win->base).oss_fillcolor);
    return;
  }
  return;
}

Assistant:

static void oss_gets_backsp(osgen_txtwin_t *win,
                            char *buf, char **p,
                            char **eol, int *x, int *y)
{
    int color;

    /* get the oss color for the current text in the window */
    color = ossgetcolor(win->base.txtfg, win->base.txtbg,
                        win->base.txtattr, win->base.fillcolor);

    /* if we can back up, do so */
    if (*p > buf)
    {
        int tmpy;
        int tmpx;

        /* move our insertion point back one position */
        --*p;
        
        /* the line is now one character shorter */
        --*eol;

        /* shift all of the characters down one position */
        if (*p != *eol)
            memmove(*p, *p + 1, *eol - *p);

        /* move the cursor back, wrapping if at the first column */
        if (--*x < win->base.winx)
        {
            *x = win->base.winx + win->base.wid - 1;
            --*y;
        }

        /* null-terminate the shortened buffer */
        **eol = '\0';

        /* 
         *   display the string from the current position, so that we update
         *   the display for the moved characters 
         */
        tmpy = *y;
        tmpx = *x;
        ossdsp_str(&win->base, tmpy, tmpx, color, *p, *eol - *p, 0);

        /* clear the screen area where the old last character was shown */
        oss_gets_csrright(win, &tmpy, &tmpx, *eol - *p);
        ossclr(tmpy, tmpx, tmpy, tmpx, win->base.oss_fillcolor);
    }
}